

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O0

int mk_vhost_get(mk_ptr_t host,mk_vhost **vhost,mk_vhost_alias **alias,mk_server *server)

{
  int iVar1;
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_list *head_alias;
  mk_list *head_vhost;
  mk_vhost_alias *entry_alias;
  mk_vhost *entry_host;
  mk_server *server_local;
  mk_vhost_alias **alias_local;
  mk_vhost **vhost_local;
  mk_ptr_t host_local;
  
  head_alias = (server->hosts).next;
  do {
    if (head_alias == &server->hosts) {
      return -1;
    }
    for (__mptr = head_alias[-5].prev; __mptr != (mk_list *)&head_alias[-6].next;
        __mptr = __mptr->next) {
      if (((ulong)*(uint *)&__mptr[-1].next == host.len) &&
         (iVar1 = strncmp(((mk_vhost_alias *)(__mptr + -1))->name,host.data,host.len), iVar1 == 0))
      {
        *vhost = (mk_vhost *)&head_alias[-7].next;
        *alias = (mk_vhost_alias *)(__mptr + -1);
        return 0;
      }
    }
    head_alias = head_alias->next;
  } while( true );
}

Assistant:

int mk_vhost_get(mk_ptr_t host, struct mk_vhost **vhost,
                 struct mk_vhost_alias **alias,
                 struct mk_server *server)
{
    struct mk_vhost *entry_host;
    struct mk_vhost_alias *entry_alias;
    struct mk_list *head_vhost, *head_alias;

    mk_list_foreach(head_vhost, &server->hosts) {
        entry_host = mk_list_entry(head_vhost, struct mk_vhost, _head);
        mk_list_foreach(head_alias, &entry_host->server_names) {
            entry_alias = mk_list_entry(head_alias, struct mk_vhost_alias, _head);
            if (entry_alias->len == host.len &&
                strncmp(entry_alias->name, host.data, host.len) == 0) {
                *vhost = entry_host;
                *alias = entry_alias;
                return 0;
            }
        }
    }

    return -1;
}